

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

int __thiscall OPLDumperMIDIDevice::Resume(OPLDumperMIDIDevice *this)

{
  OPLio *pOVar1;
  uint local_14;
  int time;
  OPLDumperMIDIDevice *this_local;
  
  local_14 = (*(this->super_OPLMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice.
               _vptr_MIDIDevice[0x1e])();
  while (local_14 != 0) {
    pOVar1 = (this->super_OPLMIDIDevice).super_OPLmusicBlock.super_musicBlock.io;
    (*pOVar1->_vptr_OPLio[6])(pOVar1,(ulong)local_14);
    local_14 = (*(this->super_OPLMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice.
                 _vptr_MIDIDevice[0x1e])();
  }
  return 0;
}

Assistant:

int OPLDumperMIDIDevice::Resume()
{
	int time;

	time = PlayTick();
	while (time != 0)
	{
		io->WriteDelay(time);
		time = PlayTick();
	}
	return 0;
}